

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int databaseIsUnmoved(Pager *pPager)

{
  int local_20;
  int local_1c;
  int rc;
  int bHasMoved;
  Pager *pPager_local;
  
  local_1c = 0;
  if (pPager->tempFile == '\0') {
    if (pPager->dbSize == 0) {
      pPager_local._4_4_ = 0;
    }
    else {
      _rc = pPager;
      local_20 = sqlite3OsFileControl(pPager->fd,0x14,&local_1c);
      if (local_20 == 0xc) {
        local_20 = 0;
      }
      else if ((local_20 == 0) && (local_1c != 0)) {
        local_20 = 0x408;
      }
      pPager_local._4_4_ = local_20;
    }
  }
  else {
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int databaseIsUnmoved(Pager *pPager){
  int bHasMoved = 0;
  int rc;

  if( pPager->tempFile ) return SQLITE_OK;
  if( pPager->dbSize==0 ) return SQLITE_OK;
  assert( pPager->zFilename && pPager->zFilename[0] );
  rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_HAS_MOVED, &bHasMoved);
  if( rc==SQLITE_NOTFOUND ){
    /* If the HAS_MOVED file-control is unimplemented, assume that the file
    ** has not been moved.  That is the historical behavior of SQLite: prior to
    ** version 3.8.3, it never checked */
    rc = SQLITE_OK;
  }else if( rc==SQLITE_OK && bHasMoved ){
    rc = SQLITE_READONLY_DBMOVED;
  }
  return rc;
}